

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O0

MPP_RET h265d_callback(void *ctx,void *err_info)

{
  uint local_3c;
  MppFrame pvStack_38;
  RK_U32 i;
  MppFrame frame;
  HEVCContext *s;
  HalDecTask *task_dec;
  H265dContext_t *h265dctx;
  void *err_info_local;
  void *ctx_local;
  
  frame = *ctx;
  s = (HEVCContext *)err_info;
  if (*(int *)(*(long *)((long)ctx + 0x50) + 0x30) == 0) {
    pvStack_38 = (MppFrame)0x0;
    task_dec = (HalDecTask *)ctx;
    h265dctx = (H265dContext_t *)err_info;
    err_info_local = ctx;
    if ((0xf < *(int *)((long)frame + 0x1158)) && (*(int *)((long)frame + 0x1158) < 0x18)) {
      _mpp_log_l(4,"H265D_PARSER","IS_IRAP frame found error",(char *)0x0);
      *(undefined4 *)((long)frame + 0x1120) = 0x7fffffff;
    }
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)frame + 0x25710),*(RK_S32 *)((long)s->vps_list + 4),
               SLOT_FRAME_PTR,&stack0xffffffffffffffc8);
    mpp_frame_set_errinfo(pvStack_38,1);
    for (local_3c = 0; local_3c < 0x11; local_3c = local_3c + 1) {
      if (*(int *)((long)frame + (ulong)local_3c * 0x40 + 0xd04) == *(int *)((long)s->vps_list + 4))
      {
        *(undefined1 *)((long)frame + (ulong)local_3c * 0x40 + 0xd08) = 1;
      }
    }
  }
  if (((ulong)s->HEVClc >> 2 & 1) == 0) {
    *(undefined1 *)((long)frame + 0x25743) = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET h265d_callback(void *ctx, void *err_info)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HalDecTask *task_dec = (HalDecTask *)err_info;
    HEVCContext *s = (HEVCContext *)h265dctx->priv_data;

    if (!h265dctx->cfg->base.disable_error) {
        MppFrame frame = NULL;
        RK_U32 i = 0;

        if (s->first_nal_type >= 16 && s->first_nal_type <= 23) {
            mpp_log("IS_IRAP frame found error");
            s->max_ra = INT_MAX;
        }
        // s->miss_ref_flag = 1;
        mpp_buf_slot_get_prop(s->slots, task_dec->output, SLOT_FRAME_PTR, &frame);
        mpp_frame_set_errinfo(frame, MPP_FRAME_ERR_UNKNOW);
        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            if (s->DPB[i].slot_index == task_dec->output) {
                s->DPB[i].error_flag = 1;
            }
        }
    }

    if (!task_dec->flags.parse_err)
        s->ps_need_upate = 0;

    (void) err_info;

    return MPP_OK;
}